

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O3

void ihevc_intra_pred_chroma_dc
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  byte bVar1;
  UWORD8 *pUVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  uVar4 = nt << 0x1e | nt - 4U >> 2;
  bVar1 = 6;
  if (uVar4 < 4) {
    bVar1 = (byte)*(undefined4 *)(&DAT_0017f820 + (ulong)uVar4 * 4);
  }
  uVar4 = nt * 2;
  iVar9 = nt * 4;
  iVar5 = 0;
  iVar7 = 0;
  if (SBORROW4(uVar4,iVar9) != nt * -2 < 0) {
    lVar3 = (long)(int)uVar4;
    iVar7 = 0;
    iVar5 = 0;
    do {
      iVar7 = iVar7 + (uint)pu1_ref[lVar3];
      iVar5 = iVar5 + (uint)pu1_ref[lVar3 + 1];
      lVar3 = lVar3 + 2;
    } while (lVar3 < iVar9);
  }
  if (iVar9 < nt * 6) {
    lVar3 = (long)iVar9;
    do {
      iVar7 = iVar7 + (uint)pu1_ref[lVar3 + 2];
      iVar5 = iVar5 + (uint)pu1_ref[lVar3 + 3];
      lVar3 = lVar3 + 2;
    } while (lVar3 < nt * 6);
  }
  if (0 < nt) {
    pUVar2 = pu1_dst + 1;
    uVar6 = 0;
    do {
      uVar8 = 0;
      do {
        pUVar2[uVar8 - 1] = (UWORD8)(iVar7 + nt >> (bVar1 & 0x1f));
        pUVar2[uVar8] = (UWORD8)(iVar5 + nt >> (bVar1 & 0x1f));
        uVar8 = uVar8 + 2;
      } while (uVar8 < uVar4);
      uVar6 = uVar6 + 1;
      pUVar2 = pUVar2 + dst_strd;
    } while (uVar6 != (uint)nt);
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_dc(UWORD8 *pu1_ref,
                                WORD32 src_strd,
                                UWORD8 *pu1_dst,
                                WORD32 dst_strd,
                                WORD32 nt,
                                WORD32 mode)
{

    WORD32 acc_dc_u, acc_dc_v;
    WORD32 dc_val_u, dc_val_v;
    WORD32 i;
    WORD32 row, col;
    WORD32 log2nt = 5;
    UNUSED(mode);
    UNUSED(src_strd);
    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }


    acc_dc_u = 0;
    acc_dc_v = 0;
    /* Calculate DC value for the transform block */
    for(i = (2 * nt); i < (4 * nt); i += 2)
    {
        acc_dc_u += pu1_ref[i];
        acc_dc_v += pu1_ref[i + 1];
    }
    for(i = ((4 * nt) + 2); i < ((6 * nt) + 2); i += 2)
    {
        acc_dc_u += pu1_ref[i];
        acc_dc_v += pu1_ref[i + 1];
    }


    dc_val_u = (acc_dc_u + nt) >> (log2nt + 1);
    dc_val_v = (acc_dc_v + nt) >> (log2nt + 1);


    /* Fill the remaining rows with DC value*/
    for(row = 0; row < nt; row++)
    {
        for(col = 0; col < (2 * nt); col += 2)
        {
            pu1_dst[(row * dst_strd) + col] = dc_val_u;
            pu1_dst[(row * dst_strd) + col + 1] = dc_val_v;
        }
    }

}